

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O1

zg_t * tchecker::zg::factory
                 (shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
                 semantics_type_t semantics_type,extrapolation_type_t extrapolation_type,
                 clockbounds_t *clock_bounds,size_t block_size,size_t table_size)

{
  zg_t *this;
  shared_ptr<tchecker::zg::semantics_t> semantics;
  shared_ptr<tchecker::zg::extrapolation_t> extrapolation;
  shared_ptr<tchecker::zg::semantics_t> local_48;
  shared_ptr<tchecker::zg::extrapolation_t> local_38;
  
  local_38.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       extrapolation_factory(extrapolation_type,clock_bounds);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::zg::extrapolation_t*>
            (&local_38.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_38.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (local_38.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (extrapolation_t *)0x0) {
    this = (zg_t *)0x0;
  }
  else {
    local_48.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         semantics_factory(semantics_type);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::zg::semantics_t*>
              (&local_48.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               local_48.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    this = (zg_t *)operator_new(0x2e0);
    zg_t::zg_t(this,system,sharing_type,&local_48,&local_38,block_size,table_size);
    if (local_48.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_38.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return this;
}

Assistant:

tchecker::zg::zg_t * factory(std::shared_ptr<tchecker::ta::system_t const> const & system,
                             enum tchecker::ts::sharing_type_t sharing_type, enum tchecker::zg::semantics_type_t semantics_type,
                             enum tchecker::zg::extrapolation_type_t extrapolation_type,
                             tchecker::clockbounds::clockbounds_t const & clock_bounds, std::size_t block_size,
                             std::size_t table_size)
{
  std::shared_ptr<tchecker::zg::extrapolation_t> extrapolation{
      tchecker::zg::extrapolation_factory(extrapolation_type, clock_bounds)};
  if (extrapolation.get() == nullptr)
    return nullptr;
  std::shared_ptr<tchecker::zg::semantics_t> semantics{tchecker::zg::semantics_factory(semantics_type)};
  return new tchecker::zg::zg_t(system, sharing_type, semantics, extrapolation, block_size, table_size);
}